

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_0::systemSupportsAddress(anon_unknown_0 *this,StringPtr addr,StringPtr service)

{
  int iVar1;
  char *__service;
  addrinfo *list;
  addrinfo *local_40;
  addrinfo local_38;
  
  local_38.ai_flags = 0x28;
  local_38.ai_family = 0;
  local_38.ai_socktype = 0;
  local_38.ai_protocol = 0;
  local_38.ai_addr = (sockaddr *)0x0;
  local_38.ai_canonname = (char *)0x0;
  local_38.ai_next = (addrinfo *)0x0;
  __service = addr.content.ptr;
  if (addr.content.size_ < 2) {
    __service = (char *)0x0;
  }
  iVar1 = getaddrinfo((char *)this,__service,&local_38,&local_40);
  if (iVar1 == 0) {
    freeaddrinfo(local_40);
  }
  return iVar1 == 0;
}

Assistant:

bool systemSupportsAddress(StringPtr addr, StringPtr service = nullptr) {
  // Can getaddrinfo() parse this addresses? This is only true if the address family (e.g., ipv6)
  // is configured on at least one interface. (The loopback interface usually has both ipv4 and
  // ipv6 configured, but not always.)
  struct addrinfo hints;
  hints.ai_family = AF_UNSPEC;
  hints.ai_socktype = 0;
#if !defined(AI_V4MAPPED)
  hints.ai_flags = AI_ADDRCONFIG;
#else
  hints.ai_flags = AI_V4MAPPED | AI_ADDRCONFIG;
#endif
  hints.ai_protocol = 0;
  hints.ai_canonname = nullptr;
  hints.ai_addr = nullptr;
  hints.ai_next = nullptr;
  struct addrinfo* list;
  int status = getaddrinfo(
      addr.cStr(), service == nullptr ? nullptr : service.cStr(), &hints, &list);
  if (status == 0) {
    freeaddrinfo(list);
    return true;
  } else {
    return false;
  }
}